

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis_helper.c
# Opt level: O3

uint32_t helper_fpackfix(uint64_t gsr,uint64_t rs2)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  
  iVar3 = 0;
  uVar2 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    lVar5 = ((long)(int)(rs2 >> (sbyte)(iVar3 << 5)) << ((byte)(gsr >> 3) & 0x1f)) >> 0x10;
    if (0x7ffe < lVar5) {
      lVar5 = 0x7fff;
    }
    if (lVar5 < -0x7fff) {
      lVar5 = -0x8000;
    }
    uVar2 = uVar2 | ((uint)lVar5 & 0xffff) << (sbyte)(iVar3 << 4);
    iVar3 = 1;
    bVar1 = false;
  } while (bVar4);
  return uVar2;
}

Assistant:

uint32_t helper_fpackfix(uint64_t gsr, uint64_t rs2)
{
    int scale = (gsr >> 3) & 0x1f;
    uint32_t ret = 0;
    int word;

    for (word = 0; word < 2; word++) {
        uint32_t val;
        int32_t src = rs2 >> (word * 32);
        int64_t scaled = (int64_t)src << scale;
        int64_t from_fixed = scaled >> 16;

        val = (from_fixed < -32768 ? -32768 :
               from_fixed > 32767 ?  32767 : from_fixed);

        ret |= (val & 0xffff) << (word * 16);
    }

    return ret;
}